

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

void __thiscall
icu_63::CalendarAstronomer::getSunLongitude
          (CalendarAstronomer *this,double jDay,double *longitude,double *meanAnomaly)

{
  double dVar1;
  double dVar2;
  double x;
  undefined8 local_28;
  
  dVar1 = norm2PI((jDay + -2447891.5) * 0.017202791632524146);
  dVar1 = norm2PI(dVar1 + 4.87650757829735 + -4.935239984568769);
  *meanAnomaly = dVar1;
  local_28 = dVar1;
  do {
    dVar2 = sin(local_28);
    x = (dVar2 * -0.016713 + local_28) - dVar1;
    dVar2 = cos(local_28);
    local_28 = local_28 - x / (dVar2 * -0.016713 + 1.0);
    dVar2 = uprv_fabs_63(x);
  } while (1e-05 < dVar2);
  dVar1 = tan(local_28 * 0.5);
  dVar1 = atan(dVar1 * 1.016855026112798);
  dVar1 = norm2PI(dVar1 + dVar1 + 4.935239984568769);
  *longitude = dVar1;
  return;
}

Assistant:

void CalendarAstronomer::getSunLongitude(double jDay, double &longitude, double &meanAnomaly)
{
    // See page 86 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    double day = jDay - JD_EPOCH;       // Days since epoch

    // Find the angular distance the sun in a fictitious
    // circular orbit has travelled since the epoch.
    double epochAngle = norm2PI(CalendarAstronomer_PI2/TROPICAL_YEAR*day);

    // The epoch wasn't at the sun's perigee; find the angular distance
    // since perigee, which is called the "mean anomaly"
    meanAnomaly = norm2PI(epochAngle + SUN_ETA_G - SUN_OMEGA_G);

    // Now find the "true anomaly", e.g. the real solar longitude
    // by solving Kepler's equation for an elliptical orbit
    // NOTE: The 3rd ed. of the book lists omega_g and eta_g in different
    // equations; omega_g is to be correct.
    longitude =  norm2PI(trueAnomaly(meanAnomaly, SUN_E) + SUN_OMEGA_G);
}